

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2shape_measures.cc
# Opt level: O2

void S2::GetChainVertices
               (S2Shape *shape,int chain_id,
               vector<Vector3<double>,_std::allocator<Vector3<double>_>_> *vertices)

{
  pointer pVVar1;
  int iVar2;
  int extraout_var;
  uint uVar3;
  bool bVar4;
  Edge edge;
  
  (*shape->_vptr_S2Shape[7])();
  iVar2 = (*shape->_vptr_S2Shape[4])(shape);
  iVar2 = (uint)(iVar2 == 1) + extraout_var;
  pVVar1 = (vertices->super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>).
           _M_impl.super__Vector_impl_data._M_start;
  if ((vertices->super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>)._M_impl.
      super__Vector_impl_data._M_finish != pVVar1) {
    (vertices->super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>)._M_impl.
    super__Vector_impl_data._M_finish = pVVar1;
  }
  std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>::reserve(vertices,(long)iVar2);
  bVar4 = ((long)iVar2 & 1U) != 0;
  if (bVar4) {
    (*shape->_vptr_S2Shape[8])(&edge,shape,(ulong)(uint)chain_id,0);
    std::vector<Vector3<double>,std::allocator<Vector3<double>>>::emplace_back<Vector3<double>>
              ((vector<Vector3<double>,std::allocator<Vector3<double>>> *)vertices,&edge.v0);
  }
  for (uVar3 = (uint)bVar4; (int)uVar3 < iVar2; uVar3 = uVar3 + 2) {
    (*shape->_vptr_S2Shape[8])(&edge,shape,(ulong)(uint)chain_id,(ulong)uVar3);
    std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>::push_back(vertices,&edge.v0);
    std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>::push_back(vertices,&edge.v1);
  }
  return;
}

Assistant:

void GetChainVertices(const S2Shape& shape, int chain_id,
                      std::vector<S2Point>* vertices) {
  S2Shape::Chain chain = shape.chain(chain_id);
  int num_vertices = chain.length + (shape.dimension() == 1);
  vertices->clear();
  vertices->reserve(num_vertices);
  int e = 0;
  if (num_vertices & 1) {
    vertices->push_back(shape.chain_edge(chain_id, e++).v0);
  }
  for (; e < num_vertices; e += 2) {
    auto edge = shape.chain_edge(chain_id, e);
    vertices->push_back(edge.v0);
    vertices->push_back(edge.v1);
  }
}